

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# check_op.h
# Opt level: O2

Nonnull<const_char_*>
absl::lts_20250127::log_internal::
MakeCheckOpString<absl::lts_20250127::Cord_const&,absl::lts_20250127::Cord_const&>
          (Cord *v1,Cord *v2,Nonnull<const_char_*> exprtext)

{
  ostream *out;
  Nonnull<const_char_*> pcVar1;
  CheckOpMessageBuilder comb;
  CheckOpMessageBuilder local_190;
  
  CheckOpMessageBuilder::CheckOpMessageBuilder(&local_190,exprtext);
  lts_20250127::operator<<((ostream *)&local_190,v1);
  out = CheckOpMessageBuilder::ForVar2(&local_190);
  lts_20250127::operator<<(out,v2);
  pcVar1 = CheckOpMessageBuilder::NewString(&local_190);
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)&local_190);
  return pcVar1;
}

Assistant:

absl::Nonnull<const char*> MakeCheckOpString(
    T1 v1, T2 v2, absl::Nonnull<const char*> exprtext) {
  CheckOpMessageBuilder comb(exprtext);
  MakeCheckOpValueString(comb.ForVar1(), v1);
  MakeCheckOpValueString(comb.ForVar2(), v2);
  return comb.NewString();
}